

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_gcc.cc
# Opt level: O1

void ScaleRowDown38_SSSE3(uint8_t *src_ptr,ptrdiff_t src_stride,uint8_t *dst_ptr,int dst_width)

{
  undefined1 (*pauVar1) [16];
  bool bVar2;
  uvec8 auVar3;
  uvec8 auVar4;
  int iVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  
  auVar4 = libyuv::kShuf38b;
  auVar3 = libyuv::kShuf38a;
  do {
    auVar6 = *(undefined1 (*) [16])src_ptr;
    pauVar1 = (undefined1 (*) [16])((long)src_ptr + 0x10);
    src_ptr = (uint8_t *)((long)src_ptr + 0x20);
    auVar6 = pshufb(auVar6,(undefined1  [16])auVar3);
    auVar7 = pshufb(*pauVar1,(undefined1  [16])auVar4);
    auVar6 = paddusb(auVar6,auVar7);
    *(long *)dst_ptr = auVar6._0_8_;
    *(int *)(dst_ptr + 8) = auVar6._8_4_;
    dst_ptr = dst_ptr + 0xc;
    iVar5 = dst_width + -0xc;
    bVar2 = 0xb < dst_width;
    dst_width = iVar5;
  } while (iVar5 != 0 && bVar2);
  return;
}

Assistant:

void ScaleRowDown38_SSSE3(const uint8_t* src_ptr,
                          ptrdiff_t src_stride,
                          uint8_t* dst_ptr,
                          int dst_width) {
  (void)src_stride;
  asm volatile(
      "movdqa      %3,%%xmm4                     \n"
      "movdqa      %4,%%xmm5                     \n"

      LABELALIGN
      "1:                                        \n"
      "movdqu      (%0),%%xmm0                   \n"
      "movdqu      0x10(%0),%%xmm1               \n"
      "lea         0x20(%0),%0                   \n"
      "pshufb      %%xmm4,%%xmm0                 \n"
      "pshufb      %%xmm5,%%xmm1                 \n"
      "paddusb     %%xmm1,%%xmm0                 \n"
      "movq        %%xmm0,(%1)                   \n"
      "movhlps     %%xmm0,%%xmm1                 \n"
      "movd        %%xmm1,0x8(%1)                \n"
      "lea         0xc(%1),%1                    \n"
      "sub         $0xc,%2                       \n"
      "jg          1b                            \n"
      : "+r"(src_ptr),   // %0
        "+r"(dst_ptr),   // %1
        "+r"(dst_width)  // %2
      : "m"(kShuf38a),   // %3
        "m"(kShuf38b)    // %4
      : "memory", "cc", "xmm0", "xmm1", "xmm4", "xmm5");
}